

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

c_non_explicit * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<c_non_explicit,boost::ext::di::v1_3_0::core::successful::any_type_1st_ref<c_non_explicit,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (stack_over_heap *this,direct *param_2,heap *param_3,
          any_type_1st_ref<c_non_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *args)

{
  any_type_1st_ref<c_non_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  *this_00;
  empty *peVar1;
  
  this_00 = (any_type_1st_ref<c_non_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
             *)operator_new(1);
  peVar1 = core::successful::any_type_1st_ref::operator_cast_to_empty_(this_00);
  c_non_explicit::c_non_explicit((c_non_explicit *)this_00,peVar1);
  return (c_non_explicit *)this_00;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::heap&, TArgs&&... args) const {
    return new T(static_cast<TArgs&&>(args)...);
  }